

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_callstack.c
# Opt level: O0

void ht_feature_callstack_stop(HT_Timeline *timeline)

{
  HT_ThreadId HVar1;
  HT_FeatureCallstack *pHVar2;
  HT_Event *event_00;
  HT_TimestampNs HVar3;
  HT_CallstackBaseEvent *event;
  HT_FeatureCallstack *f;
  HT_Timeline *timeline_local;
  
  pHVar2 = HT_FeatureCallstack_from_timeline(timeline);
  event_00 = (HT_Event *)
             ((long)(pHVar2->stack).data +
             (long)(pHVar2->stack).sizes_stack.data[(pHVar2->stack).sizes_stack.size - 1]);
  HVar3 = ht_monotonic_clock_get_timestamp();
  event_00[1].klass = (HT_EventKlass *)(HVar3 - event_00->timestamp);
  HVar1 = ht_thread_get_current_thread_id();
  *(HT_ThreadId *)&event_00[1].timestamp = HVar1;
  ht_timeline_push_event(timeline,event_00);
  ht_stack_pop(&pHVar2->stack);
  return;
}

Assistant:

void
ht_feature_callstack_stop(HT_Timeline* timeline)
{
    HT_FeatureCallstack* f = HT_FeatureCallstack_from_timeline(timeline);
    HT_CallstackBaseEvent* event = (HT_CallstackBaseEvent*)ht_stack_top(&f->stack);

    event->duration = ht_monotonic_clock_get_timestamp() - HT_EVENT(event)->timestamp;
    event->thread_id = ht_thread_get_current_thread_id();

    ht_timeline_push_event((HT_Timeline*)timeline, HT_EVENT(event));

    ht_stack_pop(&f->stack);
}